

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::DrawXFB::drawForCapture
          (DrawXFB *this,bool begin_xfb,bool pause_xfb,bool resume_xfb,bool end_xfb)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x11f7);
  if ((int)CONCAT71(in_register_00000031,begin_xfb) != 0) {
    (**(code **)(lVar3 + 0x30))(0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBeginTransformFeedback call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x11fc);
  }
  if (resume_xfb) {
    (**(code **)(lVar3 + 0x1248))();
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glResumeTransformFeedback call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1202);
  }
  (**(code **)(lVar3 + 0x538))(0,0,3);
  if (pause_xfb) {
    (**(code **)(lVar3 + 0xfe0))();
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glPauseTransformFeedback call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x120a);
  }
  if (end_xfb) {
    (**(code **)(lVar3 + 0x638))();
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glEndTransformFeedback call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1210);
  }
  (**(code **)(lVar3 + 0x4e8))(0x8c89);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glDisable call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1214);
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFB::drawForCapture(bool begin_xfb, bool pause_xfb, bool resume_xfb, bool end_xfb)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	if (begin_xfb)
	{
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");
	}

	if (resume_xfb)
	{
		gl.resumeTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glResumeTransformFeedback call failed.");
	}

	gl.drawArrays(GL_POINTS, 0, 3);

	if (pause_xfb)
	{
		gl.pauseTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback call failed.");
	}

	if (end_xfb)
	{
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");
	}

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable call failed.");
}